

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psstack.c
# Opt level: O3

void cf2_stack_roll(CF2_Stack stack,FT_Fast count,FT_Fast shift)

{
  int *piVar1;
  CF2_StackNumber *pCVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  FT_Fast FVar6;
  CF2_StackNumber CVar7;
  long lVar8;
  CF2_StackNumber CVar9;
  int iVar10;
  
  if (1 < count) {
    if ((uint)((ulong)((long)stack->top - (long)stack->buffer) >> 3) < (uint)count) {
      piVar1 = stack->error;
      if ((piVar1 != (int *)0x0) && (*piVar1 == 0)) {
        *piVar1 = 0x82;
      }
    }
    else {
      if (shift < 0) {
        uVar4 = -((uint)-shift % (uint)count);
      }
      else {
        uVar4 = (uint)shift % (uint)count;
      }
      if (uVar4 != 0) {
        CVar7.u = (anon_union_4_3_4e90abcf_for_u)0x0;
        CVar7.type = CF2_NumberInt;
        iVar3 = -1;
        iVar10 = -1;
        FVar6 = count;
        do {
          pCVar2 = stack->buffer;
          CVar9 = CVar7;
          if (iVar10 == iVar3) {
            lVar8 = (long)iVar3;
            iVar3 = iVar3 + 1;
            CVar9 = pCVar2[lVar8 + 1];
            iVar10 = iVar3;
          }
          iVar3 = iVar3 + uVar4;
          uVar5 = iVar3 >> 0x1f & count;
          if (count <= iVar3) {
            uVar5 = -count;
          }
          iVar3 = iVar3 + uVar5;
          CVar7 = pCVar2[iVar3];
          pCVar2[iVar3] = CVar9;
          FVar6 = FVar6 + -1;
        } while (FVar6 != 0);
      }
    }
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_stack_roll( CF2_Stack  stack,
                  CF2_Int    count,
                  CF2_Int    shift )
  {
    /* we initialize this variable to avoid compiler warnings */
    CF2_StackNumber  last = { { 0 }, CF2_NumberInt };

    CF2_Int  start_idx, idx, i;


    if ( count < 2 )
      return; /* nothing to do (values 0 and 1), or undefined value */

    if ( (CF2_UInt)count > cf2_stack_count( stack ) )
    {
      CF2_SET_ERROR( stack->error, Stack_Overflow );
      return;
    }

    if ( shift < 0 )
      shift = -( ( -shift ) % count );
    else
      shift %= count;

    if ( shift == 0 )
      return; /* nothing to do */

    /* We use the following algorithm to do the rolling, */
    /* which needs two temporary variables only.         */
    /*                                                   */
    /* Example:                                          */
    /*                                                   */
    /*   count = 8                                       */
    /*   shift = 2                                       */
    /*                                                   */
    /*   stack indices before roll:  7 6 5 4 3 2 1 0     */
    /*   stack indices after roll:   1 0 7 6 5 4 3 2     */
    /*                                                   */
    /* The value of index 0 gets moved to index 2, while */
    /* the old value of index 2 gets moved to index 4,   */
    /* and so on.  We thus have the following copying    */
    /* chains for shift value 2.                         */
    /*                                                   */
    /*   0 -> 2 -> 4 -> 6 -> 0                           */
    /*   1 -> 3 -> 5 -> 7 -> 1                           */
    /*                                                   */
    /* If `count' and `shift' are incommensurable, we    */
    /* have a single chain only.  Otherwise, increase    */
    /* the start index by 1 after the first chain, then  */
    /* do the next chain until all elements in all       */
    /* chains are handled.                               */

    start_idx = -1;
    idx       = -1;
    for ( i = 0; i < count; i++ )
    {
      CF2_StackNumber  tmp;


      if ( start_idx == idx )
      {
        start_idx++;
        idx  = start_idx;
        last = stack->buffer[idx];
      }

      idx += shift;
      if ( idx >= count )
        idx -= count;
      else if ( idx < 0 )
        idx += count;

      tmp                = stack->buffer[idx];
      stack->buffer[idx] = last;
      last               = tmp;
    }
  }